

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

base_learner * lda_setup(options_i *options,vw *all)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  pointer piVar5;
  undefined8 uVar6;
  size_t *psVar7;
  vw *pvVar8;
  int iVar9;
  lda *location;
  option_group_definition *poVar10;
  typed_option<float> *ptVar11;
  typed_option<unsigned_long> *op;
  typed_option<int> *op_00;
  parser *ppVar12;
  ulong uVar13;
  learner<lda,_example> *plVar14;
  byte bVar15;
  long lVar16;
  code *pcVar17;
  uint stride_shift;
  undefined **ppuVar18;
  code *pcVar19;
  label_parser *plVar20;
  ulong uVar21;
  byte bVar22;
  float fVar23;
  int math_mode;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_7;
  size_type __dnew_6;
  size_type __dnew_5;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  lda_math_mode local_7a4;
  size_t *local_7a0;
  _func_int ***local_798;
  _func_int **local_790;
  _func_int **local_788 [2];
  bool *local_778;
  vw *local_770;
  _func_int ***local_768;
  _func_int **local_760;
  _func_int **local_758 [2];
  _func_int ***local_748;
  _func_int **local_740;
  _func_int **local_738 [2];
  _func_int ***local_728;
  _func_int **local_720;
  _func_int **local_718 [2];
  _func_int ***local_708;
  _func_int **local_700;
  _func_int **local_6f8 [2];
  _func_int ***local_6e8;
  _func_int **local_6e0;
  _func_int **local_6d8 [2];
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  option_group_definition local_608;
  _func_int ***local_5d0;
  _func_int **local_5c8;
  _func_int **local_5c0 [2];
  _func_int ***local_5b0;
  _func_int **local_5a8;
  _func_int **local_5a0 [2];
  undefined7 *local_590;
  undefined8 local_588;
  undefined7 local_580;
  undefined1 uStack_579;
  undefined7 uStack_578;
  undefined1 local_571;
  string local_570;
  string local_550;
  undefined1 local_530 [112];
  bool local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  typed_option<int> local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  bVar22 = 0;
  location = calloc_or_throw<lda>(1);
  memset(location,0,400);
  local_530._0_8_ = (_func_int **)0x1b;
  local_798 = local_788;
  local_798 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_798,(ulong)local_530);
  local_788[0] = (_func_int **)local_530._0_8_;
  builtin_strncpy((char *)((long)local_798 + 0xb),"chlet Al",8);
  builtin_strncpy((char *)((long)local_798 + 0x13),"location",8);
  *(undefined4 *)local_798 = 0x6574614c;
  builtin_strncpy((char *)((long)local_798 + 4),"nt D",4);
  *(undefined4 *)(local_798 + 1) = 0x63697269;
  builtin_strncpy((char *)((long)local_798 + 0xc),"hlet",4);
  local_790 = (_func_int **)local_530._0_8_;
  *(char *)((long)local_798 + local_530._0_8_) = '\0';
  local_608.m_name._M_dataplus._M_p = (pointer)&local_608.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_608,local_798,(char *)(local_530._0_8_ + (long)local_798));
  local_608.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_608.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_608.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_798 != local_788) {
    operator_delete(local_798);
  }
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  local_628.field_2._M_allocated_capacity._0_4_ = 0x61646c;
  local_628._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_530,&local_628,&location->topics);
  local_4c0 = true;
  local_6e8 = local_6d8;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x19;
  local_6e8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_6e8,(ulong)&local_d0);
  local_6d8[0] = local_d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_6e8 + 9),"ith <int",8);
  builtin_strncpy((char *)((long)local_6e8 + 0x11),"> topics",8);
  *local_6e8 = (_func_int **)0x2061646c206e7552;
  local_6e8[1] = (_func_int **)0x6e693c2068746977;
  local_6e0 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_6e8 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                      (&local_608,(typed_option<unsigned_long> *)local_530);
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  local_648.field_2._M_allocated_capacity = 0x68706c615f61646c;
  local_648.field_2._8_2_ = 0x61;
  local_648._M_string_length = 9;
  VW::config::typed_option<float>::typed_option(&local_d0,&local_648,&location->lda_alpha);
  local_d0.super_base_option.m_keep = true;
  ptVar11 = VW::config::typed_option<float>::default_value(&local_d0,0.1);
  local_708 = local_6f8;
  local_170.super_base_option._vptr_base_option = (_func_int **)0x2f;
  local_708 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_708,(ulong)&local_170);
  local_6f8[0] = local_170.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_708 + 0x1f),"nt topic",8);
  builtin_strncpy((char *)((long)local_708 + 0x27)," weights",8);
  local_708[2] = (_func_int **)0x72657020666f2079;
  local_708[3] = (_func_int **)0x6e656d75636f642d;
  *local_708 = (_func_int **)0x6e6f20726f697250;
  local_708[1] = (_func_int **)0x7469737261707320;
  local_700 = local_170.super_base_option._vptr_base_option;
  *(char *)((long)local_708 + (long)local_170.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,ptVar11);
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  local_668.field_2._M_allocated_capacity._0_4_ = 0x5f61646c;
  local_668.field_2._M_allocated_capacity._4_3_ = 0x6f6872;
  local_668._M_string_length = 7;
  local_668.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<float>::typed_option(&local_170,&local_668,&location->lda_rho);
  local_170.super_base_option.m_keep = true;
  ptVar11 = VW::config::typed_option<float>::default_value(&local_170,0.1);
  local_728 = local_718;
  local_210.super_base_option._vptr_base_option = (_func_int **)0x28;
  local_728 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_728,(ulong)&local_210);
  local_718[0] = local_210.super_base_option._vptr_base_option;
  local_728[2] = (_func_int **)0x706f7420666f2079;
  local_728[3] = (_func_int **)0x7274736964206369;
  *local_728 = (_func_int **)0x6e6f20726f697250;
  local_728[1] = (_func_int **)0x7469737261707320;
  local_728[4] = (_func_int **)0x736e6f6974756269;
  local_720 = local_210.super_base_option._vptr_base_option;
  *(char *)((long)local_728 + (long)local_210.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,ptVar11);
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  local_688.field_2._M_allocated_capacity._0_4_ = 0x5f61646c;
  local_688.field_2._M_allocated_capacity._4_2_ = 0x44;
  local_688._M_string_length = 5;
  VW::config::typed_option<float>::typed_option(&local_210,&local_688,&location->lda_D);
  ptVar11 = VW::config::typed_option<float>::default_value(&local_210,10000.0);
  local_748 = local_738;
  local_2b0.super_base_option._vptr_base_option = (_func_int **)0x13;
  local_748 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_748,(ulong)&local_2b0);
  local_738[0] = local_2b0.super_base_option._vptr_base_option;
  *local_748 = (_func_int **)0x6f207265626d754e;
  local_748[1] = (_func_int **)0x656d75636f642066;
  builtin_strncpy((char *)((long)local_748 + 0xf),"ents",4);
  local_740 = local_2b0.super_base_option._vptr_base_option;
  *(char *)((long)local_748 + (long)local_2b0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,ptVar11);
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  local_6a8.field_2._M_allocated_capacity._0_7_ = 0x7370655f61646c;
  local_6a8.field_2._7_4_ = 0x6e6f6c69;
  local_6a8._M_string_length = 0xb;
  local_6a8.field_2._M_local_buf[0xb] = '\0';
  VW::config::typed_option<float>::typed_option(&local_2b0,&local_6a8,&location->lda_epsilon);
  ptVar11 = VW::config::typed_option<float>::default_value(&local_2b0,0.001);
  local_768 = local_758;
  local_350.super_base_option._vptr_base_option = (_func_int **)0x1a;
  local_768 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)&local_350);
  local_758[0] = local_350.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_768 + 10),"rgence t",8);
  builtin_strncpy((char *)((long)local_768 + 0x12),"hreshold",8);
  *local_768 = (_func_int **)0x6e6f6320706f6f4c;
  local_768[1] = (_func_int **)0x65636e6567726576;
  local_760 = local_350.super_base_option._vptr_base_option;
  *(char *)((long)local_768 + (long)local_350.super_base_option._vptr_base_option) = '\0';
  local_770 = all;
  std::__cxx11::string::_M_assign((string *)&(ptVar11->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                      (poVar10,ptVar11);
  local_550.field_2._M_allocated_capacity = 0x63746162696e696d;
  local_550.field_2._8_2_ = 0x68;
  local_550._M_string_length = 9;
  local_7a0 = &location->minibatch;
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  VW::config::typed_option<unsigned_long>::typed_option(&local_350,&local_550,local_7a0);
  op = VW::config::typed_option<unsigned_long>::default_value(&local_350,1);
  local_3f0.super_base_option._vptr_base_option = (_func_int **)0x17;
  local_5b0 = local_5a0;
  local_5b0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_5b0,(ulong)&local_3f0);
  local_5a0[0] = local_3f0.super_base_option._vptr_base_option;
  *local_5b0 = (_func_int **)0x63746162696e694d;
  local_5b0[1] = (_func_int **)0x202c657a69732068;
  builtin_strncpy((char *)((long)local_5b0 + 0xf)," for LDA",8);
  local_5a8 = local_3f0.super_base_option._vptr_base_option;
  *(char *)((long)local_5b0 + (long)local_3f0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                      (poVar10,op);
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  local_6c8.field_2._M_allocated_capacity = 0x646f6d2d6874616d;
  local_6c8.field_2._8_2_ = 0x65;
  local_6c8._M_string_length = 9;
  VW::config::typed_option<int>::typed_option(&local_3f0,&local_6c8,(int *)&local_7a4);
  op_00 = VW::config::typed_option<int>::default_value(&local_3f0,0);
  local_490._0_8_ = (_func_int **)0x26;
  local_5d0 = local_5c0;
  local_5d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_5d0,(ulong)local_490);
  local_5c0[0] = (_func_int **)local_490._0_8_;
  local_5d0[2] = (_func_int **)0x6361727563636120;
  local_5d0[3] = (_func_int **)0x2d74736166202c79;
  *local_5d0 = (_func_int **)0x646f6d206874614d;
  local_5d0[1] = (_func_int **)0x2c646d6973203a65;
  builtin_strncpy((char *)((long)local_5d0 + 0x1e),"t-approx",8);
  local_5c8 = (_func_int **)local_490._0_8_;
  *(char *)((long)local_5d0 + local_490._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar10 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar10,op_00);
  local_570.field_2._M_allocated_capacity._0_4_ = 0x7274656d;
  local_570.field_2._M_allocated_capacity._4_3_ = 0x736369;
  local_570._M_string_length = 7;
  local_570.field_2._M_local_buf[7] = '\0';
  local_778 = &location->compute_coherence_metrics;
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_490,&local_570,local_778)
  ;
  local_580 = 0x657475706d6f43;
  uStack_579 = 0x20;
  uStack_578 = 0x7363697274656d;
  local_588 = 0xf;
  local_571 = 0;
  local_590 = &local_580;
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar10,(typed_option<bool> *)local_490);
  if (local_590 != &local_580) {
    operator_delete(local_590);
  }
  local_490._0_8_ = &PTR__typed_option_002d60f0;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  if (local_5d0 != local_5c0) {
    operator_delete(local_5d0);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d62a8;
  if (local_3f0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p);
  }
  if (local_5b0 != local_5a0) {
    operator_delete(local_5b0);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d61c8;
  if (local_350.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p);
  }
  pvVar8 = local_770;
  if (local_768 != local_758) {
    operator_delete(local_768);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6200;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p);
  }
  if (local_748 != local_738) {
    operator_delete(local_748);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6200;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p);
  }
  if (local_728 != local_718) {
    operator_delete(local_728);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6200;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p);
  }
  if (local_708 != local_6f8) {
    operator_delete(local_708);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6200;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p);
  }
  if (local_6e8 != local_6d8) {
    operator_delete(local_6e8);
  }
  local_530._0_8_ = &PTR__typed_option_002d61c8;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_608);
  location->mmode = local_7a4;
  local_530._16_4_ = 0x61646c;
  local_530._8_8_ = (pointer)0x3;
  local_530._0_8_ = local_530 + 0x10;
  iVar9 = (*options->_vptr_options_i[1])(options,local_530);
  if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
    operator_delete((void *)local_530._0_8_);
  }
  if ((char)iVar9 == '\0') {
    plVar14 = (learner<lda,_example> *)0x0;
  }
  else {
    pvVar8->lda = (uint32_t)location->topics;
    pvVar8->delete_prediction = delete_scalars;
    piVar5 = (location->sorted_features).
             super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl.
             super__Vector_impl_data._M_start;
    (location->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (location->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (location->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar5 != (pointer)0x0) {
      operator_delete(piVar5);
    }
    location->total_lambda_init = false;
    location->all = pvVar8;
    location->example_t = (double)pvVar8->initial_t;
    if (location->compute_coherence_metrics == true) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&location->feature_counts,1L << ((byte)pvVar8->num_bits & 0x3f) & 0xffffffff);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(&location->feature_to_example_map,1L << ((byte)pvVar8->num_bits & 0x3f) & 0xffffffff)
      ;
    }
    fVar23 = logf((float)(pvVar8->lda * 2 + 1));
    fVar23 = ceilf(fVar23 / 0.6931472);
    stride_shift = (uint)(long)fVar23 |
                   (uint)(long)(fVar23 - 9.223372e+18) & (uint)((long)fVar23 >> 0x3f);
    if ((pvVar8->weights).sparse == true) {
      sparse_parameters::stride_shift(&(pvVar8->weights).sparse_weights,stride_shift);
    }
    else {
      (pvVar8->weights).dense_weights._stride_shift = stride_shift;
    }
    psVar7 = local_7a0;
    pvVar8->random_weights = true;
    pvVar8->add_constant = false;
    if (1.0 < pvVar8->eta) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"your learning rate is too high, setting it to 1",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      fVar23 = 1.0;
      if (pvVar8->eta <= 1.0) {
        fVar23 = pvVar8->eta;
      }
      pvVar8->eta = fVar23;
    }
    uVar13 = *psVar7;
    if (uVar13 < 2) {
      bVar15 = 0;
    }
    else {
      bVar15 = 0;
      uVar21 = uVar13 - 1;
      do {
        bVar15 = bVar15 + 1;
        bVar1 = 1 < uVar21;
        uVar21 = uVar21 >> 1;
      } while (bVar1);
    }
    uVar21 = 1L << (bVar15 & 0x3f);
    ppVar12 = pvVar8->p;
    if (ppVar12->ring_size < uVar21) {
      parser::~parser(ppVar12);
      operator_delete(ppVar12);
      ppVar12 = (parser *)operator_new(0x398);
      parser::parser(ppVar12,uVar21);
      pvVar8->p = ppVar12;
      uVar13 = *psVar7;
    }
    v_array<float>::resize(&location->v,pvVar8->lda * uVar13);
    local_530._0_8_ = local_530._0_8_ & 0xffffffff00000000;
    v_array<float>::push_back(&location->decay_levels,(float *)local_530);
    ppuVar18 = &no_label::no_label_parser;
    plVar20 = &pvVar8->p->lp;
    for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
      plVar20->default_label = (_func_void_void_ptr *)*ppuVar18;
      ppuVar18 = ppuVar18 + (ulong)bVar22 * -2 + 1;
      plVar20 = (label_parser *)((long)plVar20 + (ulong)bVar22 * -0x10 + 8);
    }
    bVar1 = *local_778;
    bVar2 = (pvVar8->weights).sparse;
    uVar3 = (pvVar8->weights).sparse_weights._stride_shift;
    uVar4 = (pvVar8->weights).dense_weights._stride_shift;
    plVar14 = calloc_or_throw<LEARNER::learner<lda,example>>(1);
    bVar22 = (byte)uVar4;
    if (bVar2 != false) {
      bVar22 = (byte)uVar3;
    }
    pcVar17 = learn;
    if (bVar1 != false) {
      pcVar17 = learn_with_metrics;
    }
    pcVar19 = predict;
    if (bVar1 != false) {
      pcVar19 = predict_with_metrics;
    }
    *(undefined8 *)(plVar14 + 0xd8) = 1;
    *(code **)(plVar14 + 0x10) = LEARNER::noop;
    *(code **)(plVar14 + 0x50) = LEARNER::noop_sensitivity;
    *(long *)(plVar14 + 0xe0) = 1L << (bVar22 & 0x3f);
    *(lda **)(plVar14 + 0x18) = location;
    *(code **)(plVar14 + 0x28) = pcVar17;
    *(code **)(plVar14 + 0x38) = pcVar17;
    *(code **)(plVar14 + 0x30) = pcVar19;
    *(undefined8 *)(plVar14 + 0x40) = 0;
    *(undefined4 *)(plVar14 + 0xd0) = 1;
    plVar14[0xe8] = (learner<lda,_example>)0x0;
    *(code **)(plVar14 + 0x80) = save_load;
    *(lda **)(plVar14 + 0x70) = location;
    uVar6 = *(undefined8 *)(plVar14 + 0x20);
    *(undefined8 *)(plVar14 + 0x78) = uVar6;
    *(lda **)(plVar14 + 0x58) = location;
    *(code **)(plVar14 + 0x68) = finish_example;
    *(lda **)(plVar14 + 0xa0) = location;
    *(undefined8 *)(plVar14 + 0xa8) = uVar6;
    *(code **)(plVar14 + 0xb0) = end_examples;
    *(lda **)(plVar14 + 0x88) = location;
    *(undefined8 *)(plVar14 + 0x90) = uVar6;
    *(code **)(plVar14 + 0x98) = end_pass;
    *(lda **)(plVar14 + 0xb8) = location;
    *(undefined8 *)(plVar14 + 0xc0) = uVar6;
    *(code **)(plVar14 + 200) = finish;
    location = (lda *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_608.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608.m_name._M_dataplus._M_p != &local_608.m_name.field_2) {
    operator_delete(local_608.m_name._M_dataplus._M_p);
  }
  if (location != (lda *)0x0) {
    destroy_free<lda>(location);
  }
  return (base_learner *)plVar14;
}

Assistant:

LEARNER::base_learner *lda_setup(options_i &options, vw &all)
{
  auto ld = scoped_calloc_or_throw<lda>();
  option_group_definition new_options("Latent Dirichlet Allocation");
  int math_mode;
  new_options.add(make_option("lda", ld->topics).keep().help("Run lda with <int> topics"))
      .add(make_option("lda_alpha", ld->lda_alpha)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of per-document topic weights"))
      .add(make_option("lda_rho", ld->lda_rho)
               .keep()
               .default_value(0.1f)
               .help("Prior on sparsity of topic distributions"))
      .add(make_option("lda_D", ld->lda_D).default_value(10000.0f).help("Number of documents"))
      .add(make_option("lda_epsilon", ld->lda_epsilon).default_value(0.001f).help("Loop convergence threshold"))
      .add(make_option("minibatch", ld->minibatch).default_value(1).help("Minibatch size, for LDA"))
      .add(make_option("math-mode", math_mode).default_value(USE_SIMD).help("Math mode: simd, accuracy, fast-approx"))
      .add(make_option("metrics", ld->compute_coherence_metrics).help("Compute metrics"));
  options.add_and_parse(new_options);

  // Convert from int to corresponding enum value.
  ld->mmode = static_cast<lda_math_mode>(math_mode);

  if (!options.was_supplied("lda"))
    return nullptr;

  all.lda = (uint32_t)ld->topics;
  all.delete_prediction = delete_scalars;
  ld->sorted_features = std::vector<index_feature>();
  ld->total_lambda_init = 0;
  ld->all = &all;
  ld->example_t = all.initial_t;
  if (ld->compute_coherence_metrics)
  {
    ld->feature_counts.resize((uint32_t)(UINT64_ONE << all.num_bits));
    ld->feature_to_example_map.resize((uint32_t)(UINT64_ONE << all.num_bits));
  }

  float temp = ceilf(logf((float)(all.lda * 2 + 1)) / logf(2.f));

  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;
  all.add_constant = false;

  if (all.eta > 1.)
  {
    std::cerr << "your learning rate is too high, setting it to 1" << std::endl;
    all.eta = min(all.eta, 1.f);
  }

  size_t minibatch2 = next_pow2(ld->minibatch);
  if(minibatch2 > all.p->ring_size)
  {
    delete all.p;
    all.p = new parser{minibatch2};
  }

  ld->v.resize(all.lda * ld->minibatch);

  ld->decay_levels.push_back(0.f);

  all.p->lp = no_label::no_label_parser;

  LEARNER::learner<lda, example> &l = init_learner(ld, ld->compute_coherence_metrics ? learn_with_metrics : learn,
      ld->compute_coherence_metrics ? predict_with_metrics : predict, UINT64_ONE << all.weights.stride_shift(),
      prediction_type::scalars);

  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}